

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConversionUtils.cpp
# Opt level: O0

double DIS::ConversionUtils::getOrientationFromEuler(double lat,double lon,double psi,double theta)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double b12;
  double b11;
  double sincos;
  double cosThetaSinPsi;
  double cosThetaCosPsi;
  double sinTheta;
  double sinPsi;
  double cosPsi;
  double cosTheta;
  double sinsin;
  double coslat;
  double coslon;
  double sinlon;
  double sinlat;
  double theta_local;
  double psi_local;
  double lon_local;
  double lat_local;
  
  dVar1 = sin(lat);
  dVar2 = sin(lon);
  dVar3 = cos(lon);
  dVar4 = cos(lat);
  dVar5 = cos(theta);
  dVar6 = cos(psi);
  dVar7 = sin(psi);
  dVar8 = sin(theta);
  dVar1 = atan2(-dVar2 * dVar5 * dVar6 + dVar3 * dVar5 * dVar7,
                -dVar4 * dVar8 + -(dVar1 * dVar3) * dVar5 * dVar6 + -(dVar1 * dVar2 * dVar5 * dVar7)
               );
  dVar1 = radToDeg(dVar1);
  return dVar1;
}

Assistant:

double ConversionUtils::getOrientationFromEuler(double lat, double lon, double psi, double theta)
{
    double sinlat = sin(lat);
    double sinlon = sin(lon);
    double coslon = cos(lon);
    double coslat = cos(lat);
    double sinsin = sinlat * sinlon;

    double cosTheta = cos(theta);
    double cosPsi = cos(psi);
    double sinPsi = sin(psi);
    double sinTheta = sin(theta);

    double cosThetaCosPsi = cosTheta * cosPsi;
    double cosThetaSinPsi = cosTheta * sinPsi;
    double sincos = sinlat * coslon;

    double b11 = -sinlon * cosThetaCosPsi + coslon * cosThetaSinPsi;
    double b12 = -sincos * cosThetaCosPsi - sinsin * cosThetaSinPsi - coslat * sinTheta;

    return radToDeg(atan2(b11, b12)); //range is -pi to pi
}